

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O3

void __thiscall mp::QP2PassVisitor::QP2PassVisitor(QP2PassVisitor *this,BasicProblemFlattener *flt)

{
  (this->super_ExprVisitor<mp::QP2PassVisitor,_int>).
  super_BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes>._vptr_BasicExprVisitor =
       (_func_int **)&PTR__QP2PassVisitor_005d4e60;
  this->flattener_ = flt;
  this->pass_ = 0;
  this->mode_ = 0;
  this->pass1_5_ = false;
  this->factor_ = (longdouble)1;
  this->p_ae_ = (AffineExpr *)0x0;
  this->timestamp_ = 0;
  (this->ts_lin_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ts_lin_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ts_lin_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ts_qp_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ts_qp_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ts_qp_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 0x40;
  (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.m_storage;
  (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 0x40;
  (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.m_storage;
  (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  this->n_source_terms_qp_ = 0;
  this->const_term_ = (longdouble)0;
  (this->coefs_lin_dense_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coefs_lin_dense_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefs_lin_dense_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TMatrix<double,_16U>::TMatrix(&this->coefs_qp_,0);
  (this->vperm_qp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vperm_qp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vperm_qp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

QP2PassVisitor(BasicProblemFlattener& flt)
      : flattener_(flt) { }